

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwhatsthis.cpp
# Opt level: O0

void QWhatsThisPrivate::say(QWidget *widget,QString *text,int x,int y)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  qsizetype qVar7;
  QWidget *showTextFor;
  int in_ECX;
  int in_EDX;
  QString *in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  int sy;
  int sx;
  int h;
  int w;
  QScreen *screen;
  QWhatsThat *whatsThat;
  QPoint pos;
  QRect screenRect;
  int in_stack_ffffffffffffff28;
  int in_stack_ffffffffffffff2c;
  undefined4 in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  int in_stack_ffffffffffffff38;
  int in_stack_ffffffffffffff3c;
  int in_stack_ffffffffffffff40;
  int in_stack_ffffffffffffff44;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  QScreen *local_90;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  QWhatsThat *in_stack_ffffffffffffff90;
  int local_60;
  int local_5c;
  int local_48;
  int local_44;
  int local_40;
  int local_3c [3];
  QPoint local_30;
  QPoint local_28;
  undefined1 local_20 [16];
  undefined1 local_10 [8];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  qVar7 = QString::size(in_RSI);
  if (qVar7 == 0) goto LAB_004c4cbc;
  showTextFor = (QWidget *)operator_new(0x78);
  QWhatsThat::QWhatsThat
            (in_stack_ffffffffffffff90,
             (QString *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
             (QWidget *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),showTextFor);
  if (in_RDI == 0) {
    QPoint::QPoint((QPoint *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                   in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28);
    local_90 = (QScreen *)QGuiApplication::screenAt((QPoint *)local_10);
  }
  else {
    local_90 = QWidget::screen((QWidget *)
                               CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  }
  if (local_90 == (QScreen *)0x0) {
    QGuiApplication::primaryScreen();
  }
  local_20._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_20._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_20 = QScreen::geometry();
  iVar1 = QWidget::width((QWidget *)0x4c48f5);
  iVar2 = QWidget::height((QWidget *)0x4c4903);
  iVar3 = QRect::x((QRect *)0x4c4914);
  iVar4 = QRect::y((QRect *)0x4c4925);
  local_28 = (QPoint)&DAT_aaaaaaaaaaaaaaaa;
  QPoint::QPoint((QPoint *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
  iVar6 = iVar1;
  if (in_RDI == 0) {
LAB_004c4a11:
    local_5c = in_EDX - iVar6 / 2;
  }
  else {
    QPoint::QPoint((QPoint *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                   in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28);
    local_30 = QWidget::mapToGlobal
                         ((QWidget *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                          (QPoint *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
    iVar6 = iVar1;
    local_28 = local_30;
    iVar5 = QWidget::width((QWidget *)0x4c49b8);
    if (iVar1 <= iVar5 + 0x10) goto LAB_004c4a11;
    iVar1 = QPoint::x((QPoint *)0x4c49d2);
    iVar5 = QWidget::width((QWidget *)0x4c49e3);
    local_5c = (iVar1 + iVar5 / 2) - iVar6 / 2;
  }
  iVar6 = local_5c + iVar6 + shadowWidth;
  iVar1 = QRect::width((QRect *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  if (iVar3 + iVar1 < iVar6) {
    if (in_RDI == 0) {
      QRect::width((QRect *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
    }
    else {
      local_3c[0] = QRect::width((QRect *)CONCAT44(in_stack_ffffffffffffff2c,
                                                   in_stack_ffffffffffffff28));
      iVar6 = QPoint::x((QPoint *)0x4c4a98);
      local_40 = QWidget::width((QWidget *)0x4c4aa9);
      local_40 = iVar6 + local_40;
      qMin<int>(local_3c,&local_40);
    }
  }
  iVar6 = iVar2;
  local_60 = in_ECX;
  if (in_RDI != 0) {
    iVar1 = QWidget::height((QWidget *)0x4c4b28);
    in_stack_ffffffffffffff44 = iVar2;
    if (iVar1 + 0x10 < iVar2) {
      in_stack_ffffffffffffff38 = QPoint::y((QPoint *)0x4c4b46);
      in_stack_ffffffffffffff3c = iVar4;
      iVar4 = QWidget::height((QWidget *)0x4c4b57);
      local_60 = in_stack_ffffffffffffff38 + iVar4 + 2;
      in_stack_ffffffffffffff40 = local_60 + iVar6 + 10;
      iVar4 = in_stack_ffffffffffffff3c;
      iVar1 = QRect::height((QRect *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
      in_stack_ffffffffffffff44 = iVar2;
      if (in_stack_ffffffffffffff3c + iVar1 < in_stack_ffffffffffffff40) {
        iVar1 = QPoint::y((QPoint *)0x4c4ba7);
        local_60 = ((iVar1 + 2) - shadowWidth) - iVar6;
        in_stack_ffffffffffffff44 = iVar2;
      }
    }
  }
  iVar6 = local_60 + 2 + iVar6 + shadowWidth;
  iVar1 = QRect::height((QRect *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  if (iVar4 + iVar1 < iVar6) {
    if (in_RDI == 0) {
      QRect::height((QRect *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
    }
    else {
      local_44 = QRect::height((QRect *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28
                                                ));
      iVar1 = QPoint::y((QPoint *)0x4c4c2c);
      local_48 = QWidget::height((QWidget *)0x4c4c3c);
      local_48 = iVar1 + local_48;
      qMin<int>(&local_44,&local_48);
    }
  }
  QWidget::move((QWidget *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38);
  QWidget::show((QWidget *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
  QWidget::grabKeyboard((QWidget *)CONCAT44(iVar6,iVar4));
LAB_004c4cbc:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWhatsThisPrivate::say(QWidget * widget, const QString &text, int x, int y)
{
    if (text.size() == 0)
        return;
    // make a fresh widget, and set it up
    QWhatsThat *whatsThat = new QWhatsThat(text, nullptr, widget);

    // okay, now to find a suitable location
    QScreen *screen = widget ? widget->screen()
                             : QGuiApplication::screenAt(QPoint(x, y));
    if (!screen)
        screen = QGuiApplication::primaryScreen();
    QRect screenRect = screen->geometry();

    int w = whatsThat->width();
    int h = whatsThat->height();
    int sx = screenRect.x();
    int sy = screenRect.y();

    // first try locating the widget immediately above/below,
    // with nice alignment if possible.
    QPoint pos;
    if (widget)
        pos = widget->mapToGlobal(QPoint(0,0));

    if (widget && w > widget->width() + 16)
        x = pos.x() + widget->width()/2 - w/2;
    else
        x = x - w/2;

    // squeeze it in if that would result in part of what's this
    // being only partially visible
    if (x + w  + shadowWidth > sx+screenRect.width()) {
        x = (widget ? qMin(screenRect.width(), pos.x() + widget->width())
                    : screenRect.width())
            - w;
    }

    if (x < sx)
        x = sx;

    if (widget && h > widget->height() + 16) {
        y = pos.y() + widget->height() + 2; // below, two pixels spacing
        // what's this is above or below, wherever there's most space
        if (y + h + 10 > sy + screenRect.height())
            y = pos.y() + 2 - shadowWidth - h; // above, overlap
    }
    y = y + 2;

    // squeeze it in if that would result in part of what's this
    // being only partially visible
    if (y + h + shadowWidth > sy + screenRect.height()) {
        y = (widget ? qMin(screenRect.height(), pos.y() + widget->height())
                    : screenRect.height())
            - h;
    }
    if (y < sy)
        y = sy;

    whatsThat->move(x, y);
    whatsThat->show();
    whatsThat->grabKeyboard();
}